

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::take_at_most_iterator<std::_Fwd_list_const_iterator<int>,long>>,boost::iterator_range<std::_Fwd_list_const_iterator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_long>_>
          *lhs,char *op,iterator_range<std::_Fwd_list_const_iterator<int>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *local_28;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *rhs_local;
  char *op_local;
  iterator_range<burst::take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_long>_> *lhs_local
  ;
  
  local_28 = (iterator_range<std::_Fwd_list_const_iterator<int>_> *)op;
  rhs_local = (iterator_range<std::_Fwd_list_const_iterator<int>_> *)lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<burst::take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_long>_>
               *)__return_storage_ptr__;
  toString<boost::iterator_range<burst::take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_long>_>,_true>
            (&local_58,
             (iterator_range<burst::take_at_most_iterator<std::_Fwd_list_const_iterator<int>,_long>_>
              *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }